

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

string * __thiscall
helics::CommonCore::query_abi_cxx11_
          (string *__return_storage_ptr__,CommonCore *this,string_view target,string_view queryStr,
          HelicsSequencingModes mode)

{
  atomic<int> *paVar1;
  string_view queryStr_00;
  string_view queryStr_01;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  string_view queryStr_02;
  string_view queryStr_03;
  bool bVar2;
  future_status fVar3;
  string *string;
  FederateState *fed;
  int iVar4;
  action_t aVar5;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  allocator<char> local_159;
  string_view queryStr_local;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  queryResult;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_120;
  json base;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  queryResult_1;
  ActionMessage querycmd;
  
  queryStr_local._M_str = queryStr._M_str;
  queryStr_local._M_len = queryStr._M_len;
  if (CONNECTED_ERROR < (this->super_BrokerBase).brokerState._M_i) {
    __y._M_str = "core";
    __y._M_len = 4;
    bVar2 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)target,__y);
    if ((bVar2) ||
       (__y_00._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p,
       __y_00._M_len = (this->super_BrokerBase).identifier._M_string_length,
       bVar2 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)target,__y_00),
       target._M_len == 0 || bVar2)) {
      queryStr_00._M_str = queryStr_local._M_str;
      queryStr_00._M_len = queryStr_local._M_len;
      quickCoreQueries_abi_cxx11_((string *)&querycmd,this,queryStr_00);
      if (querycmd._8_8_ != 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((GlobalFederateId *)querycmd._0_8_ == &querycmd.dest_id) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT44(querycmd.dest_handle.hid,querycmd.dest_id.gid);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = querycmd._24_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)querycmd._0_8_;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT44(querycmd.dest_handle.hid,querycmd.dest_id.gid);
        }
        __return_storage_ptr__->_M_string_length = querycmd._8_8_;
        querycmd.source_id.gid = 0;
        querycmd.source_handle.hid = 0;
        querycmd.dest_id.gid = querycmd.dest_id.gid & 0xffffff00;
        querycmd._0_8_ = &querycmd.dest_id;
        goto LAB_0028b705;
      }
      __x_00._M_str = queryStr_local._M_str;
      __x_00._M_len = queryStr_local._M_len;
      __y_04._M_str = "logs";
      __y_04._M_len = 4;
      bVar2 = std::operator==(__x_00,__y_04);
      if (bVar2) {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json(&base,(nullptr_t)0x0);
        local_138._M_allocated_capacity = 0;
        local_138._8_8_ = 0;
        queryResult.
        super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        queryResult.
        super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        loadBasicJsonInfo(this,&base,
                          (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                           *)&queryResult);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&queryResult);
        bufferToJson(&((this->super_BrokerBase).mLogManager.
                       super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      mLogBuffer,&base);
        fileops::generateJsonString(__return_storage_ptr__,&base,true);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&base.m_data);
        goto LAB_0028b705;
      }
      std::__cxx11::string::~string((string *)&querycmd);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&querycmd,"Core has terminated",(allocator<char> *)&queryResult);
    generateJsonErrorResponse(__return_storage_ptr__,DISCONNECTED,(string *)&querycmd);
LAB_0028b705:
    std::__cxx11::string::~string((string *)&querycmd);
    return __return_storage_ptr__;
  }
  aVar5 = cmd_query_ordered;
  if (mode == HELICS_SEQUENCING_MODE_FAST) {
    aVar5 = cmd_query;
  }
  ActionMessage::ActionMessage(&querycmd,aVar5);
  querycmd.source_id.gid = -0x396fe;
  querycmd.dest_id.gid = 0;
  SmallBuffer::operator=(&querycmd.payload,&queryStr_local);
  LOCK();
  paVar1 = &this->queryCounter;
  iVar4 = (paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  iVar4 = iVar4 + 1;
  querycmd.messageID = iVar4;
  ActionMessage::setStringData(&querycmd,target);
  __y_01._M_str = "core";
  __y_01._M_len = 4;
  bVar2 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)target,__y_01);
  if ((bVar2) ||
     (__y_02._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p,
     __y_02._M_len = (this->super_BrokerBase).identifier._M_string_length,
     bVar2 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)target,__y_02),
     target._M_len == 0 || bVar2)) {
    queryStr_01._M_str = queryStr_local._M_str;
    queryStr_01._M_len = queryStr_local._M_len;
    quickCoreQueries_abi_cxx11_(__return_storage_ptr__,this,queryStr_01);
    if (__return_storage_ptr__->_M_string_length != 0) goto LAB_0028b9d1;
    __x._M_str = queryStr_local._M_str;
    __x._M_len = queryStr_local._M_len;
    __y_03._M_str = "address";
    __y_03._M_len = 7;
    bVar2 = std::operator==(__x,__y_03);
    if (!bVar2) {
      aVar5 = cmd_broker_query_ordered;
      if (mode == HELICS_SEQUENCING_MODE_FAST) {
        aVar5 = cmd_broker_query;
      }
      ActionMessage::setAction(&querycmd,aVar5);
      querycmd.dest_id.gid = -0x396fe;
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      goto LAB_0028b74a;
    }
    string = getAddress_abi_cxx11_(this);
    generateJsonQuotedString((string *)&queryResult,string);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&queryResult);
LAB_0028b9cc:
    std::__cxx11::string::~string((string *)&queryResult);
  }
  else {
LAB_0028b74a:
    if (querycmd.dest_id.gid != -0x396fe) {
      __y_05._M_str = "federate";
      __y_05._M_len = 8;
      bVar2 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)target,__y_05);
      if (bVar2) {
        fed = getFederateAt(this,(LocalFederateId)0x0);
      }
      else {
        fed = getFederate(this,target);
      }
      if ((fed != (FederateState *)0x0) &&
         (querycmd.dest_id.gid = (fed->global_id)._M_i.gid, mode != HELICS_SEQUENCING_MODE_ORDERED))
      {
        queryStr_02._M_str = queryStr_local._M_str;
        queryStr_02._M_len = queryStr_local._M_len;
        federateQuery_abi_cxx11_((string *)&queryResult,this,fed,queryStr_02,false);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&queryResult,"#wait");
        if (bVar2) {
          gmlc::concurrency::
          DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::getFuture((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&queryResult_1,(int)&this->activeQueries);
          local_120 = &this->activeQueries;
          FederateState::addAction(fed,&querycmd);
          do {
            base.m_data.m_type = 0x32;
            base.m_data._1_7_ = 0;
            fVar3 = std::__basic_future<std::__cxx11::string>::wait_for<long,std::ratio<1l,1000l>>
                              ((__basic_future<std::__cxx11::string> *)&queryResult_1,
                               (duration<long,_std::ratio<1L,_1000L>_> *)&base);
            if (fVar3 != timeout) {
              if ((fVar3 == ready) || (fVar3 == deferred)) {
                std::
                future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::get(__return_storage_ptr__,&queryResult_1);
                gmlc::concurrency::
                DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::finishedWithValue(local_120,iVar4);
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&base,"Unexpected Error #13",&local_159);
                generateJsonErrorResponse(__return_storage_ptr__,INTERNAL_ERROR,(string *)&base);
                std::__cxx11::string::~string((string *)&base);
              }
              goto LAB_0028b9bd;
            }
            queryStr_03._M_str = queryStr_local._M_str;
            queryStr_03._M_len = queryStr_local._M_len;
            federateQuery_abi_cxx11_((string *)&base,this,fed,queryStr_03,false);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &queryResult,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base);
            std::__cxx11::string::~string((string *)&base);
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&queryResult,"#wait");
          } while (bVar2);
          gmlc::concurrency::
          DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::finishedWithValue(local_120,iVar4);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)queryResult.
                 super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr == &local_138) {
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 local_138._M_allocated_capacity;
            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_138._8_8_;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p =
                 (pointer)queryResult.
                          super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_state.
                          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 local_138._M_allocated_capacity;
          }
          __return_storage_ptr__->_M_string_length =
               (size_type)
               queryResult.
               super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          queryResult.
          super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_138._M_allocated_capacity = local_138._M_allocated_capacity & 0xffffffffffffff00;
          queryResult.
          super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&local_138;
LAB_0028b9bd:
          CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &queryResult_1.
                      super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)queryResult.
                 super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr == &local_138) {
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 local_138._M_allocated_capacity;
            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_138._8_8_;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p =
                 (pointer)queryResult.
                          super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_state.
                          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 local_138._M_allocated_capacity;
          }
          __return_storage_ptr__->_M_string_length =
               (size_type)
               queryResult.
               super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          queryResult.
          super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_138._M_allocated_capacity = local_138._M_allocated_capacity & 0xffffffffffffff00;
          queryResult.
          super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&local_138;
        }
        goto LAB_0028b9cc;
      }
    }
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::getFuture((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&queryResult,(int)&this->activeQueries);
    BrokerBase::addActionMessage(&this->super_BrokerBase,&querycmd);
    std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    get(__return_storage_ptr__,&queryResult);
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::finishedWithValue(&this->activeQueries,iVar4);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &queryResult.
                super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
LAB_0028b9d1:
  ActionMessage::~ActionMessage(&querycmd);
  return __return_storage_ptr__;
}

Assistant:

std::string CommonCore::query(std::string_view target,
                              std::string_view queryStr,
                              HelicsSequencingModes mode)
{
    if (getBrokerState() >= BrokerState::TERMINATING) {
        if (target == "core" || target == getIdentifier() || target.empty()) {
            auto res = quickCoreQueries(queryStr);
            if (!res.empty()) {
                return res;
            }
            if (queryStr == "logs") {
                nlohmann::json base;
                loadBasicJsonInfo(base, nullptr);
                bufferToJson(mLogManager->getLogBuffer(), base);
                return fileops::generateJsonString(base);
            }
        }
        return generateJsonErrorResponse(JsonErrorCodes::DISCONNECTED, "Core has terminated");
    }
    ActionMessage querycmd(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_QUERY : CMD_QUERY_ORDERED);
    querycmd.source_id = gDirectCoreId;
    querycmd.dest_id = parent_broker_id;
    querycmd.payload = queryStr;
    auto index = ++queryCounter;
    querycmd.messageID = index;
    querycmd.setStringData(target);

    if (target == "core" || target == getIdentifier() || target.empty()) {
        auto res = quickCoreQueries(queryStr);
        if (!res.empty()) {
            return res;
        }
        if (queryStr == "address") {
            res = generateJsonQuotedString(getAddress());
            return res;
        }
        querycmd.setAction(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_BROKER_QUERY :
                                                                 CMD_BROKER_QUERY_ORDERED);
        querycmd.dest_id = gDirectCoreId;
    }
    if (querycmd.dest_id != gDirectCoreId) {
        // default into a federate query
        auto* fed =
            (target != "federate") ? getFederate(target) : getFederateAt(LocalFederateId(0));
        if (fed != nullptr) {
            querycmd.dest_id = fed->global_id;
            if (mode != HELICS_SEQUENCING_MODE_ORDERED) {
                std::string ret = federateQuery(fed, queryStr, false);
                if (ret != "#wait") {
                    return ret;
                }

                auto queryResult = activeQueries.getFuture(querycmd.messageID);
                fed->addAction(std::move(querycmd));
                std::future_status status = std::future_status::timeout;
                while (status == std::future_status::timeout) {
                    status = queryResult.wait_for(std::chrono::milliseconds(50));
                    switch (status) {
                        case std::future_status::ready:
                        case std::future_status::deferred: {
                            auto qres = queryResult.get();
                            activeQueries.finishedWithValue(index);
                            return qres;
                        }
                        case std::future_status::timeout: {  // federate query may need to wait or
                                                             // can get the result now
                            ret = federateQuery(fed,
                                                queryStr,
                                                mode == HELICS_SEQUENCING_MODE_ORDERED);
                            if (ret != "#wait") {
                                activeQueries.finishedWithValue(index);
                                return ret;
                            }
                        } break;
                        default:
                            status = std::future_status::ready;  // LCOV_EXCL_LINE
                    }
                }
                return generateJsonErrorResponse(JsonErrorCodes::INTERNAL_ERROR,
                                                 "Unexpected Error #13");  // LCOV_EXCL_LINE
            }
        }
    }

    auto queryResult = activeQueries.getFuture(querycmd.messageID);
    addActionMessage(std::move(querycmd));
    auto ret = queryResult.get();
    activeQueries.finishedWithValue(index);
    return ret;
}